

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub2.c
# Opt level: O2

int Gia_WinAddCiWithMaxDivisors(Gia_Man_t *p,Vec_Wec_t *vLevels)

{
  bool bVar1;
  int Id;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pObj;
  int iVar4;
  int v;
  int iVar5;
  
  iVar4 = -1;
  iVar5 = -1;
  for (v = 0; v < p->vCis->nSize; v = v + 1) {
    pObj = Gia_ManCi(p,v);
    Id = Gia_ObjId(p,pObj);
    if (Id == 0) break;
    iVar2 = Gia_ObjIsTravIdCurrentId(p,Id);
    if (iVar2 == 0) {
      iVar3 = Gia_WinTryAddingNode(p,Id,-1,vLevels,(Vec_Int_t *)0x0);
      iVar2 = iVar5;
      if (iVar5 <= iVar3) {
        iVar2 = iVar3;
      }
      bVar1 = iVar5 < iVar3;
      iVar5 = iVar2;
      if (bVar1) {
        iVar4 = Id;
      }
    }
  }
  if (-1 < iVar4) {
    return iVar4;
  }
  __assert_fail("iMaxFan >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub2.c"
                ,0x28a,"int Gia_WinAddCiWithMaxDivisors(Gia_Man_t *, Vec_Wec_t *)");
}

Assistant:

int Gia_WinAddCiWithMaxDivisors( Gia_Man_t * p, Vec_Wec_t * vLevels )
{
    int i, Id, nCurFan, nMaxFan = -1, iMaxFan = -1;
    Gia_ManForEachCiId( p, Id, i )
    {
        if ( Gia_ObjIsTravIdCurrentId( p, Id ) )
            continue;
        nCurFan = Gia_WinTryAddingNode( p, Id, -1, vLevels, NULL );
        if ( nMaxFan < nCurFan )
        {
            nMaxFan = nCurFan;
            iMaxFan = Id;
        }
    }
    assert( iMaxFan >= 0 );
    return iMaxFan;
}